

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  reference pvVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  double dVar2;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_requant_out;
  float scale_requant_in;
  float bias0;
  char *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int w;
  int int32;
  float local_174;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int local_150;
  int local_14c;
  char *local_148;
  char *local_140;
  char *local_138;
  Mat local_130;
  char *local_e8;
  char *local_e0;
  value_type local_d8;
  value_type local_d4;
  float local_d0;
  char *local_c0;
  Mat local_b8;
  int local_6c;
  float *local_68;
  char *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Mat *local_30;
  int local_c;
  float local_8;
  char local_1;
  
  local_44 = *(int *)(in_RDI + 0x2c);
  local_48 = *(int *)(in_RSI + 0x2c);
  local_4c = *(int *)(in_RSI + 0x30);
  local_50 = *(int *)(in_RSI + 0x38);
  local_54 = local_44 * 2 + local_48 * -2;
  local_30 = in_RCX;
  local_60 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_68 = Mat::operator_cast_to_float_(local_30);
  for (local_6c = 0; local_6c < local_50; local_6c = local_6c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (int)((ulong)in_R8 >> 0x20));
    local_c0 = Mat::operator_cast_to_signed_char_(&local_b8);
    if (local_68 == (float *)0x0) {
      local_174 = 0.0;
    }
    else {
      local_174 = local_68[local_6c];
    }
    local_d0 = local_174;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_6c * 2));
    local_d4 = *pvVar1;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_6c * 2 + 1));
    local_d8 = *pvVar1;
    local_e0 = local_60 + local_6c * 9;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (int)((ulong)in_R8 >> 0x20));
    local_138 = Mat::operator_cast_to_signed_char_(&local_130);
    Mat::~Mat((Mat *)0x691e91);
    local_140 = local_138 + local_44;
    local_148 = local_138 + (local_44 << 1);
    local_e8 = local_138;
    for (local_14c = 0; local_14c < local_4c; local_14c = local_14c + 1) {
      for (local_150 = local_48; 0 < local_150; local_150 = local_150 + -1) {
        in_stack_fffffffffffffeac =
             (int)local_148[2] * (int)local_e0[8] +
             (int)local_148[1] * (int)local_e0[7] +
             (int)*local_148 * (int)local_e0[6] +
             (int)local_140[2] * (int)local_e0[5] +
             (int)local_140[1] * (int)local_e0[4] +
             (int)*local_140 * (int)local_e0[3] +
             (int)local_138[2] * (int)local_e0[2] +
             (int)local_138[1] * (int)local_e0[1] + (int)*local_138 * (int)*local_e0;
        local_8 = ((float)in_stack_fffffffffffffeac * local_d4 + local_d0) * local_d8;
        dVar2 = std::round((double)(ulong)(uint)local_8);
        local_c = (int)SUB84(dVar2,0);
        if (local_c < 0x80) {
          if (local_c < -0x7f) {
            local_1 = -0x7f;
          }
          else {
            local_1 = (char)local_c;
          }
        }
        else {
          local_1 = '\x7f';
        }
        *local_c0 = local_1;
        local_138 = local_138 + 2;
        local_140 = local_140 + 2;
        local_148 = local_148 + 2;
        local_c0 = local_c0 + 1;
      }
      local_138 = local_138 + local_54;
      local_140 = local_140 + local_54;
      local_148 = local_148 + local_54;
    }
    Mat::~Mat((Mat *)0x6921ad);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}